

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O3

void qpdf_oh_replace_stream_data
               (qpdf_data qpdf,qpdf_oh stream_oh,uchar *buf,size_t len,qpdf_oh filter_oh,
               qpdf_oh decode_parms_oh)

{
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_50._8_8_ = 0;
  local_50._M_unused._M_object = operator_new(0x20);
  *(qpdf_data *)local_50._M_unused._0_8_ = qpdf;
  *(uchar **)((long)local_50._M_unused._0_8_ + 8) = buf;
  *(size_t *)((long)local_50._M_unused._0_8_ + 0x10) = len;
  *(qpdf_oh *)((long)local_50._M_unused._0_8_ + 0x18) = filter_oh;
  *(qpdf_oh *)((long)local_50._M_unused._0_8_ + 0x1c) = decode_parms_oh;
  local_38 = std::
             _Function_handler<void_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1794:26)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1794:26)>
             ::_M_manager;
  do_with_oh_void(qpdf,stream_oh,(function<void_(QPDFObjectHandle_&)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  return;
}

Assistant:

void
qpdf_oh_replace_stream_data(
    qpdf_data qpdf,
    qpdf_oh stream_oh,
    unsigned char const* buf,
    size_t len,
    qpdf_oh filter_oh,
    qpdf_oh decode_parms_oh)
{
    do_with_oh_void(
        qpdf, stream_oh, [qpdf, buf, len, filter_oh, decode_parms_oh](QPDFObjectHandle& o) {
            QTC::TC("qpdf", "qpdf-c called qpdf_oh_replace_stream_data");
            auto filter = qpdf_oh_item_internal(qpdf, filter_oh);
            auto decode_parms = qpdf_oh_item_internal(qpdf, decode_parms_oh);
            // XXX test with binary data with null
            o.replaceStreamData(
                std::string(reinterpret_cast<char const*>(buf), len), filter, decode_parms);
        });
}